

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_compute_color_stats
               (LodePNGColorStats *stats,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  LodePNGColorType colortype;
  uchar b_00;
  uchar a_00;
  LodePNGColorStats *pLVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined7 uVar6;
  uchar uVar7;
  byte bVar8;
  ulong in_R11;
  ulong uVar9;
  uint uVar10;
  uchar uVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  uint uVar15;
  bool bVar16;
  byte bVar17;
  bool bVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  unsigned_short g;
  unsigned_short b;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  undefined2 local_12e;
  undefined2 local_12c;
  undefined2 local_12a;
  undefined2 local_128;
  byte local_126;
  uchar local_125;
  uint local_124;
  undefined4 local_120;
  uint local_11c;
  size_t local_118;
  uint local_10c;
  LodePNGColorStats *local_108;
  uint local_fc;
  LodePNGColorMode *local_f8;
  uchar *local_f0;
  uint local_e4;
  ulong local_e0;
  ulong local_d8;
  uint local_cc;
  undefined4 local_c8;
  uint local_c4;
  ulong local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int local_38;
  
  local_118 = (ulong)h * (ulong)w;
  colortype = mode_in->colortype;
  local_f0 = in;
  uVar2 = lodepng_can_have_alpha(mode_in);
  uVar10 = mode_in->bitdepth;
  local_f8 = mode_in;
  local_10c = getNumColorChannels(colortype);
  local_10c = local_10c * uVar10;
  uVar3 = stats->bits;
  bVar17 = local_10c == 1 && uVar3 == 1;
  uVar12 = stats->numcolors;
  local_cc = 0x101;
  if ((local_10c < 9) && (local_cc = (1 << ((byte)local_10c & 0x1f)) + uVar12, 0x100 < local_cc)) {
    local_cc = 0x101;
  }
  stats->numpixels = stats->numpixels + local_118;
  bVar18 = stats->allow_palette == 0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_38 = -1;
  uVar15 = 1;
  if (stats->alpha == 0) {
    uVar15 = uVar2 ^ 1;
  }
  bVar19 = stats->colored != 0;
  bVar16 = local_10c <= uVar3;
  bVar8 = (uVar3 == 0x10 || bVar18) || local_cc <= uVar12;
  local_108 = stats;
  uVar13 = (ulong)uVar12;
  if ((uVar3 != 0x10 && !bVar18) && local_cc > uVar12) {
    if (uVar12 == 0) {
      local_e0 = 0;
      uVar13 = local_e0;
    }
    else {
      local_11c = CONCAT31(local_11c._1_3_,bVar19);
      local_124 = CONCAT31(local_124._1_3_,bVar8);
      local_120 = CONCAT31(local_120._1_3_,bVar17);
      uVar13 = 0;
      do {
        uVar3 = color_tree_add((ColorTree *)local_b8,stats->palette[uVar13 * 4],
                               stats->palette[uVar13 * 4 + 1],stats->palette[uVar13 * 4 + 2],
                               stats->palette[uVar13 * 4 + 3],(uint)uVar13);
        if (uVar3 != 0) goto LAB_001e1fac;
        uVar13 = uVar13 + 1;
      } while (uVar13 < stats->numcolors);
      uVar10 = local_f8->bitdepth;
      bVar19 = (byte)local_11c;
      bVar8 = (byte)local_124;
      uVar13 = (ulong)stats->numcolors;
      bVar17 = (byte)local_120;
    }
  }
  local_e0 = uVar13;
  pLVar1 = local_108;
  local_11c = (uint)((colortype & ~LCT_GREY_ALPHA) == LCT_GREY | bVar19);
  if (uVar10 == 0x10) {
    local_124 = CONCAT31(local_124._1_3_,bVar8);
    local_12a = 0;
    local_12e = 0;
    local_12c = 0;
    local_128 = 0;
    if (local_118 != 0) {
      sVar14 = 0;
      do {
        getPixelColorRGBA16(&local_12a,&local_12e,&local_12c,&local_128,local_f0,sVar14,local_f8);
        if (((((local_12a & 0xff) != local_12a >> 8) || ((local_12e & 0xff) != local_12e >> 8)) ||
            ((local_12c & 0xff) != local_12c >> 8)) || ((local_128 & 0xff) != local_128 >> 8)) {
          pLVar1->bits = 0x10;
          sVar14 = 0;
          local_12a = 0;
          local_12e = 0;
          local_12c = 0;
          local_128 = 0;
          uVar3 = local_11c;
          goto LAB_001e2005;
        }
        sVar14 = sVar14 + 1;
      } while (local_118 != sVar14);
    }
    bVar8 = (byte)local_124;
  }
  local_12a = (ushort)local_12a._1_1_ << 8;
  local_12e = (ushort)local_12e._1_1_ << 8;
  local_12c = (ushort)local_12c._1_1_ << 8;
  local_128 = (ushort)local_128._1_1_ << 8;
  if (local_118 != 0) {
    local_e4 = (uint)(bVar16 | bVar17);
    uVar3 = (uint)bVar8;
    sVar14 = 0;
    uVar11 = '\0';
    uVar7 = '\0';
    bVar17 = 0;
    uVar13 = 0;
    do {
      local_124 = uVar3;
      getPixelColorRGBA8((uchar *)&local_12a,(uchar *)&local_12e,(uchar *)&local_12c,
                         (uchar *)&local_128,local_f0,sVar14,local_f8);
      bVar8 = (byte)local_12a;
      uVar9 = CONCAT71((int7)(in_R11 >> 8),(byte)local_12a);
      bVar19 = (byte)local_12e;
      b_00 = (uchar)local_12c;
      a_00 = (uchar)local_128;
      in_R11 = uVar13;
      uVar3 = local_124;
      if (((uchar)local_128 != uVar11 ||
          ((uchar)local_12c != uVar7 ||
          ((byte)local_12e != bVar17 || (byte)local_12a != (byte)uVar13))) || sVar14 == 0) {
        local_d8 = (ulong)(byte)local_12a;
        uVar12 = local_108->bits;
        if (uVar12 < 8 && local_e4 == 0) {
          uVar3 = 1;
          if ((1 < (byte)((byte)local_12a + 1)) &&
             (uVar3 = 8, (byte)((byte)local_12a * -0xf) < 0x10)) {
            uVar3 = (uint)(3 < (byte)((byte)local_12a * -3)) * 2 + 2;
          }
          if (uVar12 < uVar3) {
            local_108->bits = uVar3;
            uVar12 = uVar3;
          }
        }
        local_120 = 1;
        bVar18 = local_11c == 0;
        local_11c = 1;
        uVar3 = uVar12;
        if (bVar18) {
          uVar6 = (undefined7)((uVar9 & 0xffffffff) >> 8);
          local_120 = 0;
          local_11c = 0;
          if ((uchar)(uVar9 & 0xffffffff) != (uchar)local_12c || (byte)local_12a != (byte)local_12e)
          {
            local_108->colored = 1;
            local_120 = (undefined4)CONCAT71(uVar6,1);
            local_11c = 1;
            if (uVar12 < 8) {
              local_108->bits = 8;
              uVar3 = 8;
              local_120 = (undefined4)CONCAT71(uVar6,1);
            }
          }
        }
        local_fc = (uint)(byte)local_12e;
        if (uVar15 == 0) {
          if ((local_108->key_r == (local_12a & 0xff)) && (local_108->key_g == (local_12e & 0xff)))
          {
            bVar18 = local_108->key_b == (local_12c & 0xff);
          }
          else {
            bVar18 = false;
          }
          if ((uchar)local_128 == 0xff) {
            uVar5 = 0;
            uVar15 = 0;
            if ((bool)(local_108->key != 0 & bVar18)) {
              local_108->alpha = 1;
              local_108->key = 0;
              if (uVar3 < 8) {
                local_108->bits = 8;
              }
              goto LAB_001e1c25;
            }
          }
          else if (((uchar)local_128 == '\0') && ((bool)(local_108->key == 0 | bVar18))) {
            uVar5 = 0;
            uVar15 = 0;
            if (local_108->key == 0 && local_108->alpha == 0) {
              local_108->key = 1;
              local_108->key_r = local_12a & 0xff;
              local_108->key_g = local_12e & 0xff;
              local_108->key_b = local_12c & 0xff;
              uVar5 = 0;
            }
          }
          else {
            local_108->alpha = 1;
            local_108->key = 0;
            if (uVar3 < 8) {
              local_108->bits = 8;
              uVar5 = 1;
              uVar15 = 1;
            }
            else {
              uVar15 = 1;
              uVar5 = 1;
            }
          }
        }
        else {
LAB_001e1c25:
          uVar5 = 1;
          uVar15 = 1;
        }
        uVar3 = 1;
        local_e4 = (uint)(local_10c <= uVar12);
        uVar7 = (uchar)local_12c;
        bVar17 = (byte)local_12e;
        uVar11 = a_00;
        if (local_124 == 0) {
          local_125 = (uchar)local_12c;
          local_126 = (byte)local_12e;
          local_124 = uVar15;
          local_c8 = uVar5;
          local_c4 = uVar12;
          local_c0 = uVar9;
          iVar4 = color_tree_get((ColorTree *)local_b8,(byte)local_12a,(byte)local_12e,
                                 (uchar)local_12c,(uchar)local_128);
          in_R11 = local_c0;
          uVar15 = local_124;
          uVar7 = local_125;
          uVar3 = 0;
          bVar17 = local_126;
          if (-1 < iVar4) goto LAB_001e1cf5;
          uVar3 = color_tree_add((ColorTree *)local_b8,bVar8,bVar19,b_00,a_00,(uint)local_e0);
          if (uVar3 != 0) goto LAB_001e1fac;
          uVar3 = local_108->numcolors;
          if ((ulong)uVar3 < 0x100) {
            uVar13 = (ulong)(uVar3 * 4);
            local_108->palette[(ulong)uVar3 * 4] = (uchar)local_c0;
            local_108->palette[uVar13 + 1] = local_126;
            local_108->palette[uVar13 + 2] = local_125;
            local_108->palette[uVar13 + 3] = a_00;
          }
          uVar3 = uVar3 + 1;
          local_e0 = (ulong)uVar3;
          local_108->numcolors = uVar3;
          uVar3 = (uint)(local_cc <= uVar3);
          uVar9 = local_c0;
          uVar15 = local_124;
          uVar7 = local_125;
          uVar12 = local_c4;
          bVar17 = local_126;
          uVar5 = local_c8;
        }
        in_R11 = uVar9;
        if (((byte)((byte)local_120 & (byte)uVar5 & (byte)uVar3) == 1) && (local_10c <= uVar12))
        break;
      }
LAB_001e1cf5:
      sVar14 = sVar14 + 1;
      uVar13 = in_R11 & 0xffffffff;
    } while (local_118 != sVar14);
  }
  pLVar1 = local_108;
  if ((local_108->key != 0) && (local_108->alpha == 0 && local_118 != 0)) {
    sVar14 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_12a,(uchar *)&local_12e,(uchar *)&local_12c,
                         (uchar *)&local_128,local_f0,sVar14,local_f8);
      if (((((uchar)local_128 != '\0') && (pLVar1->key_r == (local_12a & 0xff))) &&
          (pLVar1->key_g == (local_12e & 0xff))) && (pLVar1->key_b == (local_12c & 0xff))) {
        pLVar1->alpha = 1;
        pLVar1->key = 0;
        if (pLVar1->bits < 8) {
          pLVar1->bits = 8;
        }
      }
      sVar14 = sVar14 + 1;
    } while (local_118 != sVar14);
  }
  uVar13._0_2_ = pLVar1->key_r;
  uVar13._2_2_ = pLVar1->key_g;
  uVar13._4_2_ = pLVar1->key_b;
  uVar13._6_2_ = *(undefined2 *)&pLVar1->field_0xe;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar13;
  auVar20 = psllw(auVar20,8);
  pLVar1->key_r = auVar20._0_2_ + (undefined2)uVar13;
  pLVar1->key_g = auVar20._2_2_ + uVar13._2_2_;
  pLVar1->key_b = (short)(*(int *)&pLVar1->key_b << 8) + (short)*(int *)&pLVar1->key_b;
LAB_001e1faa:
  uVar3 = 0;
LAB_001e1fac:
  color_tree_cleanup((ColorTree *)local_b8);
  return uVar3;
  while (sVar14 = sVar14 + 1, local_118 != sVar14) {
LAB_001e2005:
    getPixelColorRGBA16(&local_12a,&local_12e,&local_12c,&local_128,local_f0,sVar14,local_f8);
    pLVar1 = local_108;
    bVar18 = true;
    bVar16 = uVar3 == 0;
    uVar3 = 1;
    if (bVar16) {
      if (local_12a == local_12e) {
        bVar18 = false;
        uVar3 = 0;
        if (local_12a == local_12c) goto LAB_001e206d;
      }
      local_108->colored = 1;
      bVar18 = true;
      uVar3 = 1;
    }
LAB_001e206d:
    if (uVar15 == 0) {
      if ((local_12a == local_108->key_r) && (local_12e == local_108->key_g)) {
        bVar16 = local_12c == local_108->key_b;
      }
      else {
        bVar16 = false;
      }
      if (local_128 == 0xffff) {
        uVar15 = 0;
        if ((bool)(local_108->key != 0 & bVar16)) goto LAB_001e20f7;
      }
      else {
        if ((local_128 != 0) || (!(bool)(local_108->key == 0 | bVar16))) {
LAB_001e20f7:
          local_108->alpha = 1;
          local_108->key = 0;
          goto LAB_001e2105;
        }
        uVar15 = 0;
        if (local_108->key == 0 && local_108->alpha == 0) {
          local_108->key = 1;
          local_108->key_r = local_12a;
          local_108->key_g = local_12e;
          local_108->key_b = local_12c;
        }
      }
    }
    else {
LAB_001e2105:
      uVar15 = 1;
      if (bVar18) break;
    }
  }
  if ((local_108->key != 0) && (local_108->alpha == 0)) {
    sVar14 = 0;
    do {
      getPixelColorRGBA16(&local_12a,&local_12e,&local_12c,&local_128,local_f0,sVar14,local_f8);
      if ((((local_128 != 0) && (local_12a == pLVar1->key_r)) && (local_12e == pLVar1->key_g)) &&
         (local_12c == pLVar1->key_b)) {
        pLVar1->alpha = 1;
        pLVar1->key = 0;
      }
      sVar14 = sVar14 + 1;
    } while (local_118 != sVar14);
  }
  goto LAB_001e1faa;
}

Assistant:

unsigned lodepng_compute_color_stats(LodePNGColorStats* stats,
                                     const unsigned char* in, unsigned w, unsigned h,
                                     const LodePNGColorMode* mode_in) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (stats->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if(bpp <= 8) maxnumcolors = LODEPNG_MIN(257, stats->numcolors + (1u << bpp));

  stats->numpixels += numpixels;

  /*if palette not allowed, no need to compute numcolors*/
  if(!stats->allow_palette) numcolors_done = 1;

  color_tree_init(&tree);

  /*If the stats was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if(stats->alpha) alpha_done = 1;
  if(stats->colored) colored_done = 1;
  if(stats->bits == 16) numcolors_done = 1;
  if(stats->bits >= bpp) bits_done = 1;
  if(stats->numcolors >= maxnumcolors) numcolors_done = 1;

  if(!numcolors_done) {
    for(i = 0; i < stats->numcolors; i++) {
      const unsigned char* color = &stats->palette[i * 4];
      error = color_tree_add(&tree, color[0], color[1], color[2], color[3], (unsigned)i);
      if(error) goto cleanup;
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode_in->bitdepth == 16 && !sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/ {
        stats->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if(sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 65535 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 65535 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
    }
  } else /* < 16-bit */ {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    unsigned char pr = 0, pg = 0, pb = 0, pa = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      /*skip if color same as before, this speeds up large non-photographic
      images with many same colors by avoiding 'color_tree_has' below */
      if(i != 0 && r == pr && g == pg && b == pb && a == pa) continue;
      pr = r;
      pg = g;
      pb = b;
      pa = a;

      if(!bits_done && stats->bits < 8) {
        /*only r is checked, < 8 bits is only relevant for grayscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > stats->bits) stats->bits = bits;
      }
      bits_done = (stats->bits >= bpp);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
        if(stats->bits < 8) stats->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 255 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 255 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done) {
        if(!color_tree_has(&tree, r, g, b, a)) {
          error = color_tree_add(&tree, r, g, b, a, stats->numcolors);
          if(error) goto cleanup;
          if(stats->numcolors < 256) {
            unsigned char* p = stats->palette;
            unsigned n = stats->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++stats->numcolors;
          numcolors_done = stats->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the stats's key always 16-bit for consistency - repeat each byte twice*/
    stats->key_r += (stats->key_r << 8);
    stats->key_g += (stats->key_g << 8);
    stats->key_b += (stats->key_b << 8);
  }

cleanup:
  color_tree_cleanup(&tree);
  return error;
}